

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
FunctionMockerBase(FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0042ff90;
  MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::MockSpec
            ((MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)in_RDI,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}